

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  int iVar1;
  char *__s1;
  size_t sVar2;
  long *__s1_00;
  bool bVar3;
  string c;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,FLAGS_gtest_color_abi_cxx11_,
             DAT_0015bb28 + FLAGS_gtest_color_abi_cxx11_);
  __s1_00 = local_70[0];
  if (local_70[0] == (long *)0x0) {
    bVar3 = false;
    __s1_00 = (long *)0x0;
  }
  else {
    iVar1 = strcasecmp((char *)local_70[0],"auto");
    if (iVar1 == 0) {
      __s1 = getenv("TERM");
      if (__s1 == (char *)0x0) {
        bVar3 = false;
      }
      else {
        iVar1 = strcmp(__s1,"xterm");
        bVar3 = true;
        if ((((iVar1 != 0) && (iVar1 = strcmp(__s1,"xterm-color"), iVar1 != 0)) &&
            (iVar1 = strcmp(__s1,"xterm-kitty"), iVar1 != 0)) &&
           (((iVar1 = strcmp(__s1,"screen"), iVar1 != 0 && (iVar1 = strcmp(__s1,"tmux"), iVar1 != 0)
             ) && ((iVar1 = strcmp(__s1,"rxvt-unicode"), iVar1 != 0 &&
                   ((iVar1 = strcmp(__s1,"linux"), iVar1 != 0 &&
                    (iVar1 = strcmp(__s1,"cygwin"), iVar1 != 0)))))))) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          sVar2 = strlen(__s1);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s1,__s1 + sVar2);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-256color","");
          bVar3 = String::EndsWithCaseInsensitive(&local_90,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          __s1_00 = local_70[0];
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            __s1_00 = local_70[0];
          }
        }
      }
      bVar3 = (bool)(stdout_is_tty & bVar3);
    }
    else {
      iVar1 = strcasecmp((char *)__s1_00,"yes");
      bVar3 = true;
      if (((iVar1 != 0) && (iVar1 = strcasecmp((char *)__s1_00,"true"), iVar1 != 0)) &&
         (iVar1 = strcasecmp((char *)__s1_00,"t"), iVar1 != 0)) {
        if ((char)*__s1_00 == '1') {
          bVar3 = *(char *)((long)__s1_00 + 1) == '\0';
        }
        else {
          bVar3 = false;
        }
      }
    }
    if (__s1_00 == local_60) {
      return bVar3;
    }
  }
  operator_delete(__s1_00,local_60[0] + 1);
  return bVar3;
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  std::string c = GTEST_FLAG_GET(color);
  const char* const gtest_color = c.c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if defined(GTEST_OS_WINDOWS) && !defined(GTEST_OS_WINDOWS_MINGW)
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        term != nullptr && (String::CStringEquals(term, "xterm") ||
                            String::CStringEquals(term, "xterm-color") ||
                            String::CStringEquals(term, "xterm-kitty") ||
                            String::CStringEquals(term, "screen") ||
                            String::CStringEquals(term, "tmux") ||
                            String::CStringEquals(term, "rxvt-unicode") ||
                            String::CStringEquals(term, "linux") ||
                            String::CStringEquals(term, "cygwin") ||
                            String::EndsWithCaseInsensitive(term, "-256color"));
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
         String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}